

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

cl_int xmrig::OclLib::release(cl_kernel kernel)

{
  cl_int ret;
  char *pcVar1;
  cl_int cVar2;
  
  cVar2 = 0;
  if (kernel != (cl_kernel)0x0) {
    ret = (*pReleaseKernel)(kernel);
    cVar2 = 0;
    if (ret != 0) {
      pcVar1 = OclError::toString(ret);
      Log::print(ERR,
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
                 ,pcVar1,"clReleaseKernel");
      cVar2 = ret;
    }
  }
  return cVar2;
}

Assistant:

cl_int xmrig::OclLib::release(cl_kernel kernel) noexcept
{
    assert(pReleaseKernel != nullptr);

    if (kernel == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~kernel %s", kernel, getUint(kernel, CL_KERNEL_REFERENCE_COUNT), getString(kernel, CL_KERNEL_FUNCTION_NAME).data());

    const cl_int ret = pReleaseKernel(kernel);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseKernel);
    }

    return ret;
}